

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O3

void __thiscall
MxxColl_All2allvGeneral_Test::~MxxColl_All2allvGeneral_Test(MxxColl_All2allvGeneral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, All2allvGeneral) {
    mxx::comm c;

    srand(0); // make test reproducable
    std::vector<size_t> send_counts(c.size());
    std::vector<size_t> recv_counts(c.size());
    std::vector<std::pair<int, double> > msgs;
    for (int i = 0; i < c.size(); ++i) {
        send_counts[i] = 2*c.rank() + 3*(c.size()-i-1);
        recv_counts[i] = 2*i + 3*(c.size()-c.rank()-1);
        for (size_t j = 0; j < send_counts[i]; ++j) {
            msgs.push_back(std::make_pair(c.rank()*i, 1.0 / rand()));
        }
    }
    size_t recv_size = std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0));

    // send one way
    std::vector<std::pair<int, double> > result = mxx::all2allv(msgs, send_counts, recv_counts, c);

    ASSERT_EQ(recv_size, result.size());
    std::vector<std::pair<int, double> >::iterator it = result.begin();
    for (int i = 0; i < c.size(); ++i) {
        for (size_t j = 0; j < recv_counts[i]; ++j) {
            ASSERT_EQ(i*c.rank(), it->first);
            // square the double:
            it->second *= it->second;
            it++;
        }
    }

    // send back
    std::vector<std::pair<int, double> > result2 = mxx::all2allv(&result[0], recv_counts, send_counts);

    // check that the msgs and result2 are same in first and squared in second
    ASSERT_EQ(msgs.size(), result2.size());
    for (size_t i = 0; i < result2.size(); ++i) {
        ASSERT_EQ(msgs[i].first, result2[i].first);
        ASSERT_EQ(msgs[i].second*msgs[i].second, result2[i].second);
    }
}